

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O1

void __thiscall
boost::unit_test::test_observer::assertion_result(test_observer *this,assertion_result ar)

{
  byte bVar1;
  undefined8 in_RDX;
  
  if (ar == AR_PASSED) {
    bVar1 = 1;
  }
  else {
    if (ar != AR_FAILED) {
      return;
    }
    bVar1 = 0;
  }
  (*this->_vptr_test_observer[0xb])(this,(ulong)bVar1,in_RDX,this->_vptr_test_observer[0xb]);
  return;
}

Assistant:

virtual void    assertion_result( unit_test::assertion_result ar )
    {
        switch( ar ) {
        case AR_PASSED: assertion_result( true ); break;
        case AR_FAILED: assertion_result( false ); break;
        case AR_TRIGGERED: break;
        default: break;
        }
    }